

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O0

bool __thiscall
Clasp::DefaultMinimize::commitLowerBound(DefaultMinimize *this,Solver *s,bool upShared)

{
  uint uVar1;
  bool bVar2;
  wsum_t *pwVar3;
  long lVar4;
  byte in_DL;
  Solver *in_RDI;
  wsum_t sv;
  wsum_t L;
  uint32 x;
  bool more;
  bool act;
  wsum_t in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined2 in_stack_ffffffffffffffc4;
  undefined1 in_stack_ffffffffffffffc6;
  undefined1 in_stack_ffffffffffffffc7;
  undefined1 uVar5;
  undefined4 in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  uint32 at;
  SharedMinimizeData *in_stack_ffffffffffffffd8;
  long local_20;
  
  bVar2 = active((DefaultMinimize *)
                 CONCAT17(in_stack_ffffffffffffffc7,
                          CONCAT16(in_stack_ffffffffffffffc6,
                                   CONCAT24(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0))));
  at = in_stack_ffffffffffffffd4 & 0xffffff;
  if (bVar2) {
    bVar2 = SharedMinimizeData::checkNext
                      ((SharedMinimizeData *)
                       CONCAT17(in_stack_ffffffffffffffc7,
                                CONCAT16(in_stack_ffffffffffffffc6,
                                         CONCAT24(in_stack_ffffffffffffffc4,
                                                  in_stack_ffffffffffffffc0))));
    at = CONCAT13(bVar2,(int3)at);
  }
  bVar2 = false;
  if (((*(uint *)&((Step *)&(in_RDI->stats).super_CoreStats.restarts)->field_0x4 & 0x3fffffff) <
       (uint)(in_RDI->stats).super_CoreStats.analyzed) &&
     (in_stack_ffffffffffffffc6 = true, bVar2 = (bool)in_stack_ffffffffffffffc6,
     ((Step *)&(in_RDI->stats).super_CoreStats.restarts)->size < 2)) {
    in_stack_ffffffffffffffc6 =
         (*(uint *)&((Step *)&(in_RDI->stats).super_CoreStats.restarts)->field_0x4 & 0x3fffffff) !=
         (uint32)(in_RDI->stats).super_CoreStats.analyzed - 1;
    bVar2 = (bool)in_stack_ffffffffffffffc6;
  }
  if ((((char)(at >> 0x18) != '\0') &&
      (*(uint *)&((Step *)&(in_RDI->stats).super_CoreStats.restarts)->field_0x4 >> 0x1e != 0)) &&
     ((*(uint *)&((Step *)&(in_RDI->stats).super_CoreStats.restarts)->field_0x4 & 0x3fffffff) <
      (uint)(in_RDI->stats).super_CoreStats.analyzed)) {
    uVar1 = *(uint *)&((Step *)&(in_RDI->stats).super_CoreStats.restarts)->field_0x4;
    uVar5 = bVar2;
    pwVar3 = opt((DefaultMinimize *)in_RDI);
    lVar4 = pwVar3[uVar1 & 0x3fffffff] + 1;
    local_20 = lVar4;
    if (((in_DL & 1) != 0) &&
       (local_20 = SharedMinimizeData::incLower(in_stack_ffffffffffffffd8,at,(wsum_t)in_RDI),
       local_20 == lVar4)) {
      MinimizeConstraint::reportLower
                ((MinimizeConstraint *)CONCAT44(at,in_stack_ffffffffffffffd0),in_RDI,
                 CONCAT13(uVar5,CONCAT12(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc4)),
                 in_stack_ffffffffffffffb8);
      local_20 = lVar4;
    }
    pwVar3 = stepLow((DefaultMinimize *)
                     CONCAT17(uVar5,CONCAT16(in_stack_ffffffffffffffc6,
                                             CONCAT24(in_stack_ffffffffffffffc4,
                                                      in_stack_ffffffffffffffc0))));
    *pwVar3 = local_20;
    if (*(uint *)&((Step *)&(in_RDI->stats).super_CoreStats.restarts)->field_0x4 >> 0x1e == 2) {
      ((Step *)&(in_RDI->stats).super_CoreStats.restarts)->size = 1;
    }
  }
  return bVar2;
}

Assistant:

bool DefaultMinimize::commitLowerBound(Solver& s, bool upShared) {
	bool act  = active() && shared_->checkNext();
	bool more = step_.lev < size_ && (step_.size > 1 || step_.lev != size_-1);
	if (act && step_.type && step_.lev < size_) {
		uint32 x = step_.lev;
		wsum_t L = opt()[x] + 1;
		if (upShared) {
			wsum_t sv = shared_->incLower(x, L);
			if (sv == L) { reportLower(s, x, sv); }
			else         { L = sv; }
		}
		stepLow()= L;
		if (step_.type == OptParams::bb_inc){ step_.size = 1; }
	}
	return more;
}